

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::copyReorderingFrom
          (CollationSettings *this,CollationSettings *other,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  CollationSettings *other_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    UVar1 = hasReordering(other);
    if (UVar1 == '\0') {
      resetReordering(this);
    }
    else {
      this->minHighNoReorder = other->minHighNoReorder;
      if (other->reorderCodesCapacity == 0) {
        this->reorderTable = other->reorderTable;
        this->reorderRanges = other->reorderRanges;
        this->reorderRangesLength = other->reorderRangesLength;
        this->reorderCodes = other->reorderCodes;
        this->reorderCodesLength = other->reorderCodesLength;
      }
      else {
        setReorderArrays(this,other->reorderCodes,other->reorderCodesLength,other->reorderRanges,
                         other->reorderRangesLength,other->reorderTable,errorCode);
      }
    }
  }
  return;
}

Assistant:

void
CollationSettings::copyReorderingFrom(const CollationSettings &other, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(!other.hasReordering()) {
        resetReordering();
        return;
    }
    minHighNoReorder = other.minHighNoReorder;
    if(other.reorderCodesCapacity == 0) {
        // The reorder arrays are aliased to memory-mapped data.
        reorderTable = other.reorderTable;
        reorderRanges = other.reorderRanges;
        reorderRangesLength = other.reorderRangesLength;
        reorderCodes = other.reorderCodes;
        reorderCodesLength = other.reorderCodesLength;
    } else {
        setReorderArrays(other.reorderCodes, other.reorderCodesLength,
                         other.reorderRanges, other.reorderRangesLength,
                         other.reorderTable, errorCode);
    }
}